

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

char * conf_get_str_nthstrkey(Conf *conf,int primary,int n)

{
  int *piVar1;
  int local_3c;
  int *piStack_38;
  int index;
  conf_entry *entry;
  constkey key;
  int n_local;
  int primary_local;
  Conf *conf_local;
  
  key.secondary.i = n;
  key.secondary._4_4_ = primary;
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x16e,"char *conf_get_str_nthstrkey(Conf *, int, int)");
  }
  if (valuetypes[primary] == 3) {
    key._0_8_ = (long)anon_var_dwarf_248df + 10;
    entry._0_4_ = primary;
    piStack_38 = (int *)findrelpos234(conf->tree,&entry,conf_cmp_constkey,4,&local_3c);
    if ((piStack_38 == (int *)0x0) || (*piStack_38 != key.secondary._4_4_)) {
      conf_local = (Conf *)0x0;
    }
    else {
      piVar1 = (int *)index234(conf->tree,local_3c + key.secondary.i);
      if ((piVar1 == (int *)0x0) || (*piVar1 != key.secondary._4_4_)) {
        conf_local = (Conf *)0x0;
      }
      else {
        conf_local = *(Conf **)(piVar1 + 2);
      }
    }
    return (char *)conf_local;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x16f,"char *conf_get_str_nthstrkey(Conf *, int, int)");
}

Assistant:

char *conf_get_str_nthstrkey(Conf *conf, int primary, int n)
{
    struct constkey key;
    struct conf_entry *entry;
    int index;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = "";
    entry = findrelpos234(conf->tree, &key, conf_cmp_constkey,
                          REL234_GE, &index);
    if (!entry || entry->key.primary != primary)
        return NULL;
    entry = index234(conf->tree, index + n);
    if (!entry || entry->key.primary != primary)
        return NULL;
    return entry->key.secondary.s;
}